

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullable.cpp
# Opt level: O0

void __thiscall
clickhouse::ColumnNullable::ColumnNullable(ColumnNullable *this,ColumnRef *nested,ColumnRef *nulls)

{
  int iVar1;
  element_type *peVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  runtime_error *this_00;
  TypeRef *in_RSI;
  undefined8 *in_RDI;
  Column *in_stack_ffffffffffffff68;
  shared_ptr<clickhouse::Column> *in_stack_ffffffffffffff70;
  TypeRef *in_stack_ffffffffffffff78;
  Column *in_stack_ffffffffffffff80;
  Column *this_01;
  long lVar3;
  
  std::__shared_ptr_access<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x212208);
  Column::Type(in_stack_ffffffffffffff68);
  Type::CreateNullable(in_RSI);
  Column::Column(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  std::shared_ptr<clickhouse::Type>::~shared_ptr((shared_ptr<clickhouse::Type> *)0x212246);
  std::shared_ptr<clickhouse::Type>::~shared_ptr((shared_ptr<clickhouse::Type> *)0x212250);
  *in_RDI = &PTR__ColumnNullable_002a0278;
  std::shared_ptr<clickhouse::Column>::shared_ptr
            (in_stack_ffffffffffffff70,(shared_ptr<clickhouse::Column> *)in_stack_ffffffffffffff68);
  this_01 = (Column *)(in_RDI + 7);
  std::__shared_ptr_access<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x21228e);
  Column::As<clickhouse::ColumnVector<unsigned_char>>(this_01);
  peVar2 = std::__shared_ptr_access<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x2122ab);
  iVar1 = (*peVar2->_vptr_Column[6])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  peVar2 = std::__shared_ptr_access<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x2122c8);
  iVar1 = (*peVar2->_vptr_Column[6])();
  if (lVar3 != CONCAT44(extraout_var_00,iVar1)) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"count of elements in nested and nulls should be the same");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

ColumnNullable::ColumnNullable(ColumnRef nested, ColumnRef nulls)
    : Column(Type::CreateNullable(nested->Type()))
    , nested_(nested)
    , nulls_(nulls->As<ColumnUInt8>())
{
    if (nested_->Size() != nulls->Size()) {
        throw std::runtime_error("count of elements in nested and nulls should be the same");
    }
}